

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curl_wrapper.cc
# Opt level: O3

void __thiscall
prometheus::detail::CurlWrapper::CurlWrapper
          (CurlWrapper *this,function<void_(void_*)> *presetupCurl)

{
  undefined4 in_EAX;
  int iVar1;
  undefined4 in_register_00000004;
  CURL *pCVar2;
  curl_slist *pcVar3;
  runtime_error *this_00;
  CURL *local_28;
  
  local_28 = (CURL *)CONCAT44(in_register_00000004,in_EAX);
  *(undefined8 *)((long)&(this->mutex_).super___mutex_base._M_mutex + 0x10) = 0;
  (this->mutex_).super___mutex_base._M_mutex.__data.__list.__prev = (__pthread_internal_list *)0x0;
  (this->mutex_).super___mutex_base._M_mutex.__align = 0;
  *(undefined8 *)((long)&(this->mutex_).super___mutex_base._M_mutex + 8) = 0;
  (this->mutex_).super___mutex_base._M_mutex.__data.__list.__next = (__pthread_internal_list *)0x0;
  ::std::function<void_(void_*)>::function(&this->presetupCurl_,presetupCurl);
  iVar1 = curl_global_init(3);
  if (iVar1 == 0) {
    pCVar2 = (CURL *)curl_easy_init();
    this->curl_ = pCVar2;
    if (pCVar2 == (CURL *)0x0) {
      curl_global_cleanup();
      this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
      ::std::runtime_error::runtime_error(this_00,"Cannot initialize easy curl!");
    }
    else {
      if ((this->presetupCurl_).super__Function_base._M_manager != (_Manager_type)0x0) {
        local_28 = pCVar2;
        (*(this->presetupCurl_)._M_invoker)((_Any_data *)&this->presetupCurl_,&local_28);
      }
      pcVar3 = (curl_slist *)
               curl_slist_append(0,"Content-Type: text/plain; version=0.0.4; charset=utf-8");
      this->optHttpHeader_ = pcVar3;
      if (pcVar3 != (curl_slist *)0x0) {
        return;
      }
      this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
      ::std::runtime_error::runtime_error(this_00,"Cannot append the header of the content type");
    }
  }
  else {
    this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
    ::std::runtime_error::runtime_error(this_00,"Cannot initialize global curl!");
  }
  __cxa_throw(this_00,&::std::runtime_error::typeinfo,::std::runtime_error::~runtime_error);
}

Assistant:

CurlWrapper::CurlWrapper(std::function<void(CURL*)> presetupCurl)
    : presetupCurl_(presetupCurl) {
  /* In windows, this will init the winsock stuff */
  auto error = curl_global_init(CURL_GLOBAL_ALL);
  if (error) {
    throw std::runtime_error("Cannot initialize global curl!");
  }

  curl_ = curl_easy_init();
  if (!curl_) {
    curl_global_cleanup();
    throw std::runtime_error("Cannot initialize easy curl!");
  }

  if (presetupCurl_) {
    presetupCurl_(curl_);  
  }

  optHttpHeader_ = curl_slist_append(nullptr, CONTENT_TYPE);
  if (!optHttpHeader_) {
    throw std::runtime_error("Cannot append the header of the content type");
  }
}